

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestFixturesWithThrowingCtorsAreFailures::
~TestFixturesWithThrowingCtorsAreFailures(TestFixturesWithThrowingCtorsAreFailures *this)

{
  TestFixturesWithThrowingCtorsAreFailures *this_local;
  
  ~TestFixturesWithThrowingCtorsAreFailures(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(FixturesWithThrowingCtorsAreFailures)
{
	CHECK(throwingFixtureTestList1.GetHead() != NULL);
	RecordingReporter reporter;
	TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResult(result);
		throwingFixtureTestList1.GetHead()->Run();
	}

	int const failureCount = result.GetFailedTestCount();
	CHECK_EQUAL(1, failureCount);
	CHECK(strstr(reporter.lastFailedMessage, "while constructing fixture"));
}